

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O0

int fy_parse_tag_directive(fy_parser *fyp,fy_token *fyt)

{
  _Bool _Var1;
  _Bool local_81;
  undefined1 local_80 [8];
  fy_diag_report_ctx _drc;
  size_t sStack_50;
  _Bool can_override;
  size_t prefix_size;
  size_t handle_size;
  char *prefix;
  char *handle;
  fy_token *fyt_td;
  fy_document_state *fyds;
  fy_token *fyt_local;
  fy_parser *fyp_local;
  
  fyt_td = (fy_token *)fyp->current_document_state;
  fyds = (fy_document_state *)fyt;
  fyt_local = (fy_token *)fyp;
  if (fyt_td == (fy_token *)0x0) {
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0x18c,"fy_parse_tag_directive","no current document state error");
  }
  else {
    prefix = fy_tag_directive_token_handle(fyt,&prefix_size);
    if (prefix == (char *)0x0) {
      fy_parser_diag((fy_parser *)fyt_local,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                     ,400,"fy_parse_tag_directive","bad tag directive token (handle)");
    }
    else {
      handle_size = (size_t)fy_tag_directive_token_prefix((fy_token *)fyds,&stack0xffffffffffffffb0)
      ;
      if ((char *)handle_size == (char *)0x0) {
        fy_parser_diag((fy_parser *)fyt_local,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,0x194,"fy_parse_tag_directive","bad tag directive token (prefix)");
      }
      else {
        handle = (char *)fy_document_state_lookup_tag_directive
                                   ((fy_document_state *)fyt_td,prefix,prefix_size);
        local_81 = false;
        if ((fy_token *)handle != (fy_token *)0x0) {
          local_81 = fy_token_tag_directive_is_overridable((fy_token *)handle);
        }
        _drc.override_column._3_1_ = local_81;
        if ((handle == (char *)0x0) || (local_81 != false)) {
          if (handle != (char *)0x0) {
            fy_parser_diag((fy_parser *)fyt_local,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0x19f,"fy_parse_tag_directive","overriding tag");
            fy_token_list_del((fy_token_list *)&(fyt_td->handle).end_mark,(fy_token *)handle);
            fy_token_unref((fy_token *)handle);
          }
          fy_token_list_add_tail((fy_token_list *)&(fyt_td->handle).end_mark,(fy_token *)fyds);
          fyds = (fy_document_state *)0x0;
          fy_parser_diag((fy_parser *)fyt_local,0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x1a8,"fy_parse_tag_directive",
                         "document parsed tag directive with handle=%.*s",(int)prefix_size,prefix);
          _Var1 = fy_tag_is_default(prefix,prefix_size,(char *)handle_size,sStack_50);
          if (!_Var1) {
            fyt_td->field_0x1c = fyt_td->field_0x1c & 0xfd | 2;
          }
          return 0;
        }
        memset(local_80,0,0x28);
        local_80._0_4_ = FYET_ERROR;
        local_80._4_4_ = FYEM_PARSE;
        _drc._0_8_ = fy_token_ref((fy_token *)fyds);
        fy_parser_diag_report
                  ((fy_parser *)fyt_local,(fy_diag_report_ctx *)local_80,"duplicate tag directive");
      }
    }
  }
  fy_token_unref((fy_token *)fyds);
  return -1;
}

Assistant:

int fy_parse_tag_directive(struct fy_parser *fyp, struct fy_token *fyt) {
    struct fy_document_state *fyds;
    struct fy_token *fyt_td;
    const char *handle, *prefix;
    size_t handle_size, prefix_size;
    bool can_override;

    fyds = fyp->current_document_state;
    fyp_error_check(fyp, fyds, err_out,
                    "no current document state error");

    handle = fy_tag_directive_token_handle(fyt, &handle_size);
    fyp_error_check(fyp, handle, err_out,
                    "bad tag directive token (handle)");

    prefix = fy_tag_directive_token_prefix(fyt, &prefix_size);
    fyp_error_check(fyp, prefix, err_out,
                    "bad tag directive token (prefix)");

    fyt_td = fy_document_state_lookup_tag_directive(fyds, handle, handle_size);

    can_override = fyt_td && fy_token_tag_directive_is_overridable(fyt_td);

    FYP_TOKEN_ERROR_CHECK(fyp, fyt, FYEM_PARSE,
                          !fyt_td || can_override, err_out,
                          "duplicate tag directive");

    if (fyt_td) {
        fyp_notice(fyp, "overriding tag");
        fy_token_list_del(&fyds->fyt_td, fyt_td);
        fy_token_unref(fyt_td);
    }

    fy_token_list_add_tail(&fyds->fyt_td, fyt);
    fyt = NULL;

    fyp_scan_debug(fyp, "document parsed tag directive with handle=%.*s",
                   (int) handle_size, handle);

    if (!fy_tag_is_default(handle, handle_size, prefix, prefix_size))
        fyds->tags_explicit = true;

    return 0;
    err_out:
    fy_token_unref(fyt);
    return -1;
}